

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O3

void __thiscall pmx::PmxVertex::Read(PmxVertex *this,istream *stream,PmxSetting *setting)

{
  PmxVertexSkinning *pPVar1;
  PmxVertexSkinning *pPVar2;
  undefined8 *puVar3;
  undefined **ppuVar4;
  float (*pafVar5) [4];
  ulong uVar6;
  
  std::istream::read((char *)stream,(long)this);
  std::istream::read((char *)stream,(long)this->normal);
  std::istream::read((char *)stream,(long)this->uv);
  if (setting->uv != '\0') {
    pafVar5 = this->uva;
    uVar6 = 0;
    do {
      std::istream::read((char *)stream,(long)pafVar5);
      uVar6 = uVar6 + 1;
      pafVar5 = pafVar5 + 1;
    } while (uVar6 < setting->uv);
  }
  std::istream::read((char *)stream,(long)&this->skinning_type);
  switch(this->skinning_type) {
  case BDEF1:
    pPVar2 = (PmxVertexSkinning *)operator_new(0x10);
    pPVar2->_vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_0010ab20;
    *(undefined4 *)&pPVar2[1]._vptr_PmxVertexSkinning = 0;
    break;
  case BDEF2:
    pPVar2 = (PmxVertexSkinning *)operator_new(0x18);
    pPVar2->_vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_0010ab50;
    pPVar2[1]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    *(undefined4 *)&pPVar2[2]._vptr_PmxVertexSkinning = 0;
    break;
  case BDEF4:
    pPVar2 = (PmxVertexSkinning *)operator_new(0x28);
    ppuVar4 = &PTR_Read_0010ab80;
    goto LAB_00105d92;
  case SDEF:
    pPVar2 = (PmxVertexSkinning *)operator_new(0x38);
    pPVar2->_vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_0010abb0;
    pPVar2[1]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[2]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[3]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[4]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[5]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[6]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    break;
  case QDEF:
    pPVar2 = (PmxVertexSkinning *)operator_new(0x28);
    ppuVar4 = &PTR_Read_0010abe0;
LAB_00105d92:
    pPVar2->_vptr_PmxVertexSkinning = (_func_int **)ppuVar4;
    pPVar2[1]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[2]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[3]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    pPVar2[4]._vptr_PmxVertexSkinning = (_func_int **)0x0;
    break;
  default:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "invalid skinning type";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  pPVar1 = (this->skinning)._M_t.
           super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>
           .super__Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>._M_head_impl;
  (this->skinning)._M_t.
  super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>.
  super__Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>._M_head_impl = pPVar2;
  if (pPVar1 != (PmxVertexSkinning *)0x0) {
    operator_delete(pPVar1,8);
  }
  pPVar2 = (this->skinning)._M_t.
           super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>
           .super__Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>._M_head_impl;
  (**pPVar2->_vptr_PmxVertexSkinning)(pPVar2,stream,setting);
  std::istream::read((char *)stream,(long)&this->edge);
  return;
}

Assistant:

void PmxVertex::Read(std::istream *stream, PmxSetting *setting)
	{
		stream->read((char*) this->positon, sizeof(float) * 3);
		stream->read((char*) this->normal, sizeof(float) * 3);
		stream->read((char*) this->uv, sizeof(float) * 2);
		for (int i = 0; i < setting->uv; ++i)
		{
			stream->read((char*) this->uva[i], sizeof(float) * 4);
		}
		stream->read((char*) &this->skinning_type, sizeof(PmxVertexSkinningType));
		switch (this->skinning_type)
		{
		case PmxVertexSkinningType::BDEF1:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF1>();
			break;
		case PmxVertexSkinningType::BDEF2:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF2>();
			break;
		case PmxVertexSkinningType::BDEF4:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF4>();
			break;
		case PmxVertexSkinningType::SDEF:
			this->skinning = std::make_unique<PmxVertexSkinningSDEF>();
			break;
		case PmxVertexSkinningType::QDEF:
			this->skinning = std::make_unique<PmxVertexSkinningQDEF>();
			break;
		default:
			throw "invalid skinning type";
		}
		this->skinning->Read(stream, setting);
		stream->read((char*) &this->edge, sizeof(float));
	}